

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64(CodedInputStream *this,uint64_t *value)

{
  int iVar1;
  uint8_t *puVar2;
  uint64_t *value_local;
  CodedInputStream *this_local;
  
  iVar1 = BufferSize(this);
  if (iVar1 < 8) {
    this_local._7_1_ = ReadLittleEndian64Fallback(this,value);
  }
  else {
    puVar2 = ReadLittleEndian64FromArray(this->buffer_,value);
    this->buffer_ = puVar2;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool CodedInputStream::ReadLittleEndian64(uint64_t* value) {
#if defined(PROTOBUF_LITTLE_ENDIAN)
  if (PROTOBUF_PREDICT_TRUE(BufferSize() >= static_cast<int>(sizeof(*value)))) {
    buffer_ = ReadLittleEndian64FromArray(buffer_, value);
    return true;
  } else {
    return ReadLittleEndian64Fallback(value);
  }
#else
  return ReadLittleEndian64Fallback(value);
#endif
}